

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

float haarY(integral_image *iimage,int row,int col,int s)

{
  int rows;
  float fVar1;
  float fVar2;
  
  rows = s / 2;
  fVar1 = box_integral(iimage,row,col - rows,rows,s);
  fVar2 = box_integral(iimage,row - rows,col - rows,rows,s);
  return fVar1 - fVar2;
}

Assistant:

inline float haarY(struct integral_image *iimage, int row, int col, int s) {
    return box_integral(iimage, row, col-s/2, s/2, s) - box_integral(iimage, row-s/2, col-s/2, s/2, s); // 1 x add + 2 x box_integral(3 x add + 1 x fmax) => Total: 7 x add + 2 x fmax
}